

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

SymID __thiscall IRBuilder::BuildSrcStackSymID(IRBuilder *this,RegSlot regSlot)

{
  BVFixed *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  SymID SVar4;
  RegSlot RVar5;
  JITTimeFunctionBody *pJVar6;
  undefined4 *puVar7;
  
  if (regSlot < this->firstTemp) {
    bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
    if (!bVar2) {
      return regSlot;
    }
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar2 = JITTimeFunctionBody::RegIsConstant(pJVar6,regSlot);
    if (bVar2) {
      return regSlot;
    }
  }
  else {
    SVar4 = GetMappedTemp(this,regSlot);
    if (SVar4 != 0) {
      return SVar4;
    }
    bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x4c8,"(this->IsLoopBody())","this->IsLoopBody()");
      if (!bVar2) goto LAB_004c8da2;
      *puVar7 = 0;
    }
    this_00 = this->m_usedAsTemp;
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar5 = JITTimeFunctionBody::GetFirstTmpReg(pJVar6);
    BVar3 = BVFixed::Test(this_00,regSlot - RVar5);
    if (BVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x4c9,
                         "(!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg()))"
                         ,
                         "!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg())"
                        );
      if (!bVar2) {
LAB_004c8da2:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    SetMappedTemp(this,regSlot,regSlot);
  }
  EnsureLoopBodyLoadSlot(this,regSlot,false);
  return regSlot;
}

Assistant:

SymID
IRBuilder::BuildSrcStackSymID(Js::RegSlot regSlot)
{
    SymID symID;

    if (this->RegIsTemp(regSlot))
    {
        // This is a use of a temp. Map the reg slot to its sym ID.
        //     !!!NOTE: always process an instruction's temp uses before its temp defs!!!
        symID = this->GetMappedTemp(regSlot);
        if (symID == 0)
        {
            // We might have temps that are live through the loop body via "with" statement
            // We need to treat those as if they are locals and don't remap them
            Assert(this->IsLoopBody());
            Assert(!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg()));

            symID = static_cast<SymID>(regSlot);
            this->SetMappedTemp(regSlot, symID);
            this->EnsureLoopBodyLoadSlot(symID);
        }
    }
    else
    {
        symID = static_cast<SymID>(regSlot);
        if (IsLoopBody() && !this->RegIsConstant(regSlot))
        {
            this->EnsureLoopBodyLoadSlot(symID);
        }
    }
    return symID;
}